

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O0

int ldecode(lua_State *L)

{
  int iVar1;
  sproto_type *st_00;
  size_t sStack_58;
  int r;
  size_t sz;
  decode_ud self;
  void *buffer;
  sproto_type *st;
  lua_State *L_local;
  
  st_00 = (sproto_type *)lua_touserdata(L,1);
  if (st_00 == (sproto_type *)0x0) {
    L_local._4_4_ = luaL_argerror(L,1,"Need a sproto_type object");
  }
  else {
    sStack_58 = 0;
    self._32_8_ = getbuffer(L,2,&stack0xffffffffffffffa8);
    iVar1 = lua_type(L,-1);
    if (iVar1 != 5) {
      lua_createtable(L,0,0);
    }
    luaL_checkstack(L,200,(char *)0x0);
    sz = (size_t)L;
    self.array_tag._4_4_ = lua_gettop(L);
    self.array_tag._0_4_ = 0;
    self.L = (lua_State *)0x0;
    self.array_index = 0;
    self.result_index = -1;
    self.deep = 0;
    iVar1 = sproto_decode(st_00,(void *)self._32_8_,(int)sStack_58,decode,&sz);
    if (iVar1 < 0) {
      L_local._4_4_ = luaL_error(L,"decode error");
    }
    else {
      lua_settop(L,self.array_tag._4_4_);
      lua_pushinteger(L,(long)iVar1);
      L_local._4_4_ = 2;
    }
  }
  return L_local._4_4_;
}

Assistant:

static int
ldecode(lua_State *L) {
	const int32_t * data = lua_touserdata(L,1);
	if (data == NULL) {
		return 0;
	}
	const uint8_t * b = (const uint8_t *)data;
	int32_t len = get_length(b);
	struct bson_reader br = { b , len };

	unpack_dict(L, &br, false);

	return 1;
}